

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void strdump(char *e,char *p,wchar_t ewidth,wchar_t utf8)

{
  wchar_t wVar1;
  size_t sVar2;
  byte *pbVar3;
  uint local_54;
  uint local_44;
  wchar_t cnt;
  wchar_t n;
  uint32_t uc;
  size_t len;
  byte *pbStack_28;
  uint c;
  char *q;
  wchar_t utf8_local;
  wchar_t ewidth_local;
  char *p_local;
  char *e_local;
  
  pbStack_28 = (byte *)p;
  q._0_4_ = utf8;
  q._4_4_ = ewidth;
  _utf8_local = (byte *)p;
  p_local = e;
  logprintf("      %*s = ",(ulong)(uint)ewidth,e);
  if (_utf8_local == (byte *)0x0) {
    logprintf("NULL\n");
  }
  else {
    logprintf("\"");
    while (*_utf8_local != 0) {
      pbVar3 = _utf8_local + 1;
      len._4_4_ = (uint)*_utf8_local;
      _utf8_local = pbVar3;
      switch(len._4_4_) {
      case 7:
        logprintf("\\a");
        break;
      case 8:
        logprintf("\\b");
        break;
      default:
        if ((len._4_4_ < 0x20) || (0x7e < len._4_4_)) {
          logprintf("\\x%02X",(ulong)len._4_4_);
        }
        else {
          logprintf("%c",(ulong)len._4_4_);
        }
        break;
      case 10:
        logprintf("\\n");
        break;
      case 0xd:
        logprintf("\\r");
      }
    }
    logprintf("\"");
    if (pbStack_28 == (byte *)0x0) {
      local_54 = 0xffffffff;
    }
    else {
      sVar2 = strlen((char *)pbStack_28);
      local_54 = (uint)sVar2;
    }
    logprintf(" (length %d)",(ulong)local_54);
    if ((wchar_t)q != L'\0') {
      local_44 = 0;
      _utf8_local = pbStack_28;
      _n = strlen((char *)pbStack_28);
      logprintf(" [");
      while (wVar1 = _utf8_to_unicode((uint32_t *)&cnt,(char *)_utf8_local,_n), L'\0' < wVar1) {
        if (_utf8_local != pbStack_28) {
          logprintf(" ");
        }
        logprintf("%04X",(ulong)(uint)cnt);
        _utf8_local = _utf8_local + wVar1;
        _n = _n - (long)wVar1;
        local_44 = local_44 + 1;
      }
      logprintf("]");
      logprintf(" (count %d",(ulong)local_44);
      if (wVar1 < L'\0') {
        logprintf(",unknown %zu bytes",_n);
      }
      logprintf(")");
    }
    logprintf("\n");
  }
  return;
}

Assistant:

static void strdump(const char *e, const char *p, int ewidth, int utf8)
{
	const char *q = p;

	logprintf("      %*s = ", ewidth, e);
	if (p == NULL) {
		logprintf("NULL\n");
		return;
	}
	logprintf("\"");
	while (*p != '\0') {
		unsigned int c = 0xff & *p++;
		switch (c) {
		case '\a': logprintf("\\a"); break;
		case '\b': logprintf("\\b"); break;
		case '\n': logprintf("\\n"); break;
		case '\r': logprintf("\\r"); break;
		default:
			if (c >= 32 && c < 127)
				logprintf("%c", (int)c);
			else
				logprintf("\\x%02X", c);
		}
	}
	logprintf("\"");
	logprintf(" (length %d)", q == NULL ? -1 : (int)strlen(q));

	/*
	 * If the current string is UTF-8, dump its code points.
	 */
	if (utf8) {
		size_t len;
		uint32_t uc;
		int n;
		int cnt = 0;

		p = q;
		len = strlen(p);
		logprintf(" [");
		while ((n = _utf8_to_unicode(&uc, p, len)) > 0) {
			if (p != q)
				logprintf(" ");
			logprintf("%04X", uc);
			p += n;
			len -= n;
			cnt++;
		}
		logprintf("]");
		logprintf(" (count %d", cnt);
		if (n < 0) {
			logprintf(",unknown %zu bytes", len);
		}
		logprintf(")");

	}
	logprintf("\n");
}